

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.c
# Opt level: O3

void raviX_output_cfg(Proc *proc,FILE *fp)

{
  Graph *g;
  CfgArg args;
  FILE *local_28;
  Proc *local_20;
  
  g = proc->cfg;
  if (g != (Graph *)0x0) {
    fprintf((FILE *)fp,"digraph Proc%d {\n",(ulong)proc->id);
    local_28 = fp;
    local_20 = proc;
    raviX_for_each_node(g,output_node,&local_28);
    fwrite("}\n",2,1,(FILE *)fp);
  }
  return;
}

Assistant:

void raviX_output_cfg(Proc *proc, FILE *fp)
{
	Graph *g = proc->cfg;
	if (!g)
		return;
	fprintf(fp, "digraph Proc%d {\n", proc->id);
	struct CfgArg args = {fp, proc};
	raviX_for_each_node(g, output_node, &args);
	fprintf(fp, "}\n");
}